

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rb.c
# Opt level: O0

lgx_rb_node_t * lgx_rb_get_greater(lgx_rb_t *rbt,lgx_str_t *key)

{
  longlong lVar1;
  lgx_rb_node_t *local_28;
  lgx_rb_node_t *ret;
  lgx_rb_node_t *node;
  lgx_str_t *key_local;
  lgx_rb_t *rbt_local;
  
  local_28 = (lgx_rb_node_t *)0x0;
  ret = rbt->root;
  while (ret != (lgx_rb_node_t *)0x0) {
    lVar1 = rb_compare(rbt,&ret->key,key);
    if (lVar1 < 1) {
      ret = ret->right;
    }
    else {
      local_28 = ret;
      ret = ret->left;
    }
  }
  return local_28;
}

Assistant:

lgx_rb_node_t * lgx_rb_get_greater(lgx_rb_t *rbt, lgx_str_t *key) {
    lgx_rb_node_t *node, *ret = NULL;
    
    node = rbt->root;
    
    while(node) {
        if(rb_compare(rbt, &node->key, key) > 0) {
            ret = node;
            node = node->left;
        } else {
            node = node->right;
        }
    }
    
    return ret;
}